

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile.cc
# Opt level: O2

Frag __thiscall re2::Compiler::Quest(Compiler *this,Frag a,bool nongreedy)

{
  undefined1 auVar1 [13];
  uint uVar2;
  PatchList PVar3;
  undefined8 uVar4;
  Compiler *this_00;
  Inst *this_01;
  uint uVar5;
  uint32_t out;
  Frag FVar6;
  uint32_t uStack_44;
  uint32_t uStack_40;
  undefined4 uStack_3c;
  Frag a_local;
  
  out = a.begin;
  if (out == 0) {
    FVar6 = Nop(this);
    auVar1 = FVar6._0_13_;
  }
  else {
    this_00 = this;
    uVar2 = AllocInst(this,1);
    if (-1 < (int)uVar2) {
      this_01 = (this->inst_).ptr_._M_t.
                super___uniq_ptr_impl<re2::Prog::Inst,_re2::PODArray<re2::Prog::Inst>::Deleter>._M_t
                .super__Tuple_impl<0UL,_re2::Prog::Inst_*,_re2::PODArray<re2::Prog::Inst>::Deleter>.
                super__Head_base<0UL,_re2::Prog::Inst_*,_false>._M_head_impl + uVar2;
      uVar5 = uVar2 * 2;
      if (nongreedy) {
        Prog::Inst::InitAlt(this_01,0,out);
      }
      else {
        Prog::Inst::InitAlt(this_01,out,0);
        uVar5 = uVar5 | 1;
      }
      PVar3 = PatchList::Append((this->inst_).ptr_._M_t.
                                super___uniq_ptr_impl<re2::Prog::Inst,_re2::PODArray<re2::Prog::Inst>::Deleter>
                                ._M_t.
                                super__Tuple_impl<0UL,_re2::Prog::Inst_*,_re2::PODArray<re2::Prog::Inst>::Deleter>
                                .super__Head_base<0UL,_re2::Prog::Inst_*,_false>._M_head_impl,
                                (PatchList)((ulong)uVar5 * 0x100000001),a.end);
      uStack_44 = PVar3.head;
      uStack_40 = PVar3.tail;
      uStack_3c = CONCAT31(uStack_3c._1_3_,1);
      uVar4 = CONCAT44(uStack_44,uVar2);
      goto LAB_001e3441;
    }
    FVar6 = NoMatch(this_00);
    auVar1 = FVar6._0_13_;
  }
  uVar4 = auVar1._0_8_;
  uStack_40 = auVar1._8_4_;
  uStack_3c = CONCAT31(uStack_3c._1_3_,auVar1[0xc]);
LAB_001e3441:
  FVar6._12_4_ = uStack_3c;
  FVar6.end.tail = uStack_40;
  FVar6.begin = (int)uVar4;
  FVar6.end.head = (int)((ulong)uVar4 >> 0x20);
  return FVar6;
}

Assistant:

Frag Compiler::Quest(Frag a, bool nongreedy) {
  if (IsNoMatch(a))
    return Nop();
  int id = AllocInst(1);
  if (id < 0)
    return NoMatch();
  PatchList pl;
  if (nongreedy) {
    inst_[id].InitAlt(0, a.begin);
    pl = PatchList::Mk(id << 1);
  } else {
    inst_[id].InitAlt(a.begin, 0);
    pl = PatchList::Mk((id << 1) | 1);
  }
  return Frag(id, PatchList::Append(inst_.data(), pl, a.end), true);
}